

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

int32_t parse_frame(int64_t k)

{
  long in_RDI;
  int32_t randomize;
  int64_t in_stack_00000030;
  int32_t in_stack_0000003c;
  int64_t in_stack_00000040;
  int32_t in_stack_00000084;
  int64_t in_stack_000000f0;
  int32_t in_stack_0000017c;
  int64_t in_stack_00000180;
  
  if (0 < in_RDI) {
    transition(in_stack_00000030);
  }
  msg(2,"parsing frame %ld",in_RDI);
  parse_state_part(in_stack_000000f0);
  parse_input_part(in_stack_00000030);
  if (in_RDI == 0) {
    initialize_states(in_stack_00000084);
  }
  initialize_inputs(in_stack_00000040,in_stack_0000003c);
  simulate_step(in_stack_00000180,in_stack_0000017c);
  return (int32_t)((found_end_of_witness != 0 ^ 0xffU) & 1);
}

Assistant:

static int32_t
parse_frame (int64_t k)
{
  if (k > 0) transition (k);
  msg (2, "parsing frame %" PRId64, k);
  parse_state_part (k);
  parse_input_part (k);
  const int32_t randomize = 0;
  if (!k) initialize_states (randomize);
  initialize_inputs (k, randomize);
  simulate_step (k, randomize);
  return !found_end_of_witness;
}